

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::pixie::FieldEncodingMethods::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldEncodingMethods *this,
          FieldEncodingEnum field_encoding)

{
  invalid_argument *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  string sStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar5 = (uint)this;
  if ((int)uVar5 < 0x53) {
    switch(uVar5) {
    case 0x30:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "NOOP";
      pcVar4 = "";
      break;
    case 0x31:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED1";
      pcVar4 = "";
      break;
    case 0x32:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED2";
      pcVar4 = "";
      break;
    case 0x33:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED3";
      pcVar4 = "";
      break;
    case 0x34:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED4";
      pcVar4 = "";
      break;
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x41:
switchD_0017dc37_caseD_35:
      this_00 = (invalid_argument *)
                __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,field_encoding));
      std::__cxx11::to_string(&sStack_c8,uVar5 & 0xff);
      std::operator+(&local_68,"unrecognised field encoding code: ",&sStack_c8);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_a8._M_dataplus._M_p = (pointer)*plVar1;
      psVar2 = (size_type *)(plVar1 + 2);
      if ((size_type *)local_a8._M_dataplus._M_p == psVar2) {
        local_a8.field_2._M_allocated_capacity = *psVar2;
        local_a8.field_2._8_8_ = plVar1[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar2;
      }
      local_a8._M_string_length = plVar1[1];
      *plVar1 = (long)psVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::operator+(&local_48,&local_a8,(char)this);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88 = (long *)*plVar1;
      plVar3 = plVar1 + 2;
      if (local_88 == plVar3) {
        local_78 = *plVar3;
        lStack_70 = plVar1[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar3;
      }
      local_80 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::invalid_argument::invalid_argument(this_00,(string *)&local_88);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    case 0x38:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED8";
      pcVar4 = "";
      break;
    case 0x40:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "FIXED16";
      pcVar4 = "";
      break;
    case 0x42:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "BYTE_ARRAY";
      pcVar4 = "";
      break;
    default:
      if (uVar5 != 0) goto switchD_0017dc37_caseD_35;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "NOT_DEFINED";
      pcVar4 = "";
    }
  }
  else if (uVar5 == 0x53) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "VARINT_STRING";
    pcVar4 = "";
  }
  else if (uVar5 == 0x56) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "VARINT";
    pcVar4 = "";
  }
  else {
    if (uVar5 != 0x5a) goto switchD_0017dc37_caseD_35;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "ZIGZAG";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldEncodingMethods::ToString(FieldEncodingEnum field_encoding)
{
    switch (field_encoding)
    {
        case FieldEncodingEnum::NOOP:
            return "NOOP";
        case FieldEncodingEnum::FIXED1:
            return "FIXED1";
        case FieldEncodingEnum::FIXED2:
            return "FIXED2";
        case FieldEncodingEnum::FIXED3:
            return "FIXED3";
        case FieldEncodingEnum::FIXED4:
            return "FIXED4";
        case FieldEncodingEnum::FIXED8:
            return "FIXED8";
        case FieldEncodingEnum::FIXED16:
            return "FIXED16";
        case FieldEncodingEnum::BYTE_ARRAY:
            return "BYTE_ARRAY";
        case FieldEncodingEnum::VARINT:
            return "VARINT";
        case FieldEncodingEnum::VARINT_STRING:
            return "VARINT_STRING";
        case FieldEncodingEnum::ZIGZAG:
            return "ZIGZAG";
        case FieldEncodingEnum::NOT_DEFINED:
            return "NOT_DEFINED";
        default:
            throw std::invalid_argument("unrecognised field encoding code: " +
                                        std::to_string(field_encoding) + " ('" + (char) field_encoding + "').");
    }
}